

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

bool __thiscall QGridLayout::hasHeightForWidth(QGridLayout *this)

{
  bool bVar1;
  QGridLayoutPrivate *this_00;
  QGridLayoutPrivate *in_RDI;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  this_00 = d_func((QGridLayout *)0x3353cc);
  horizontalSpacing((QGridLayout *)this_00);
  verticalSpacing((QGridLayout *)this_00);
  bVar1 = QGridLayoutPrivate::hasHeightForWidth
                    (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return bVar1;
}

Assistant:

bool QGridLayout::hasHeightForWidth() const
{
    return const_cast<QGridLayout*>(this)->d_func()->hasHeightForWidth(horizontalSpacing(), verticalSpacing());
}